

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O0

void sprintf<unsigned_long>(stringstream *oss,string *fmt,unsigned_long value)

{
  ulong uVar1;
  fmtflags __a;
  _Ios_Fmtflags _Var2;
  int __n;
  ulong uVar3;
  char *pcVar4;
  undefined1 *puVar5;
  long *plVar6;
  ostream *poVar7;
  runtime_error *this;
  char *in_RSI;
  long *in_RDI;
  invalid_argument *e_1;
  size_t afterpos_1;
  int precision;
  invalid_argument *e;
  int width;
  size_t afterpos;
  size_t fpos;
  bool alternateForm;
  size_t pos;
  size_t *in_stack_fffffffffffffeb8;
  string *in_stack_fffffffffffffec0;
  string local_e0 [44];
  int local_b4;
  string local_b0 [32];
  long local_90;
  int local_84;
  int local_78;
  string local_68 [36];
  int local_44;
  long local_40;
  char local_31;
  ulong local_30;
  byte local_21;
  ulong local_20;
  char *local_10;
  long *local_8;
  
  local_20 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  do {
    uVar1 = local_20;
    uVar3 = std::__cxx11::string::size();
    if (uVar3 <= uVar1) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"extra arguments provided to sprintf");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_10);
    if (*pcVar4 == '%') {
      local_20 = local_20 + 1;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_10);
      if (*pcVar4 != '%') {
        local_21 = 0;
        local_30 = std::__cxx11::string::find_first_of(local_10,0x15a20f);
        break;
      }
    }
    poVar7 = (ostream *)(local_8 + 2);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_10);
    std::operator<<(poVar7,*pcVar4);
    local_20 = local_20 + 1;
  } while( true );
LAB_0011fdc0:
  if (local_30 <= local_20) {
LAB_0011fed1:
    std::__cxx11::string::substr((ulong)local_68,(ulong)local_10);
    __n = std::__cxx11::stoi(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,0);
    std::__cxx11::string::~string(local_68);
    poVar7 = (ostream *)(local_8 + 2);
    local_44 = __n;
    local_78 = (int)std::setw(__n);
    std::operator<<(poVar7,(_Setw)local_78);
    local_20 = local_40 + local_20;
    local_84 = 0;
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_10);
    if (*pcVar4 == '.') {
      local_20 = local_20 + 1;
      std::__cxx11::string::substr((ulong)local_b0,(ulong)local_10);
      local_84 = std::__cxx11::stoi(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,0);
      std::__cxx11::string::~string(local_b0);
      poVar7 = (ostream *)(local_8 + 2);
      local_b4 = (int)std::setprecision(local_84);
      std::operator<<(poVar7,(_Setprecision)local_b4);
      local_84 = 0;
      local_20 = local_90 + local_20;
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_10);
    if (((*pcVar4 == 'x') ||
        (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_10), *pcVar4 == 'X')) &&
       (std::ostream::operator<<(local_8 + 2,std::hex), (local_21 & 1) != 0)) {
      std::ostream::operator<<(local_8 + 2,std::showbase);
    }
    streamout<unsigned_long>
              ((stringstream *)in_stack_fffffffffffffec0,(unsigned_long)in_stack_fffffffffffffeb8,0)
    ;
    local_20 = local_20 + 1;
    std::__cxx11::string::substr((ulong)local_e0,(ulong)local_10);
    sprintf((char *)local_8,(char *)local_e0);
    std::__cxx11::string::~string(local_e0);
    return;
  }
  puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_10);
  switch(*puVar5) {
  case 0x20:
    break;
  default:
    goto LAB_0011fed1;
  case 0x23:
    local_21 = 1;
    break;
  case 0x2b:
    std::ostream::operator<<(local_8 + 2,std::showpos);
    break;
  case 0x2d:
    std::ostream::operator<<(local_8 + 2,std::left);
    break;
  case 0x30:
    __a = std::ios_base::flags((ios_base *)((long)local_8 + *(long *)(*local_8 + -0x18)));
    _Var2 = std::operator&(__a,_S_left);
    if (_Var2 == ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max)) {
      plVar6 = local_8 + 2;
      local_31 = (char)std::setfill<char>('0');
      std::operator<<(plVar6,local_31);
    }
  }
  local_20 = local_20 + 1;
  goto LAB_0011fdc0;
}

Assistant:

void
sprintf(stringstream& oss, const string& fmt, T value, Args ... args)
{
    for (size_t pos = 0; pos < fmt.size(); pos++) {
        if (fmt[pos] == '%' && fmt[++pos] != '%') {
            bool alternateForm = false;
            // Find the format character
            size_t fpos = fmt.find_first_of("diouXxfFeEgGaAcsb", pos);
            for (; pos < fpos; pos++) {
                switch (fmt[pos]) {
                  case '#':
                    alternateForm = true;
                    continue;
                  case '-':
                    oss << left;
                    continue;
                  case '+':
                    oss << showpos;
                    continue;
                  case ' ':
                    continue;
                  case '0':
                    if (!(oss.flags() & oss.left))
                        oss << setfill('0');
                    continue;
                  default:
                    break;
                }
                break;
            }
            try {
                size_t afterpos;
                int width = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                oss << setw(width);
                pos += afterpos;
            } catch (invalid_argument& e) {
                (void)e;
            }
            int precision = 0;
            if (fmt[pos] == '.') try {
                size_t afterpos;
                ++pos;
                precision = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                if (!std::is_same<T, const char*>::value) {
                     oss << setprecision(precision);
                     precision = 0;
                }
                pos += afterpos;
            } catch (invalid_argument& e) {
                throw std::runtime_error("Expected precision value in sprintf");
                (void)e;
            }
            if (fmt[pos] == 'x' || fmt[pos] == 'X') {
                oss << hex;
                if (alternateForm) oss << showbase;
            }
            // Having another function call sucks. See streamout for the reason.
            streamout(oss, value, precision);
            return sprintf(oss, fmt.substr(++pos), args...);
        }
        oss << fmt[pos];
    }
    throw std::runtime_error("extra arguments provided to sprintf");
}